

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O1

size_t nhdp_domain_process_mprtypes_tlv
                 (uint8_t *mprtypes,size_t mprtypes_size,rfc5444_reader_tlvblock_entry *tlv)

{
  size_t sVar1;
  list_entity *plVar2;
  
  if (tlv == (rfc5444_reader_tlvblock_entry *)0x0) {
    *mprtypes = *(uint8_t *)((long)&_domain_list.next[-0x27].next + 1);
    sVar1 = 1;
  }
  else {
    memset(mprtypes,0xff,mprtypes_size);
    plVar2 = &_domain_list;
    sVar1 = 0;
    do {
      plVar2 = plVar2->next;
      if (plVar2->prev == _domain_list.prev) {
        return sVar1;
      }
      mprtypes[sVar1] = *(uint8_t *)((long)&plVar2[-0x27].next + 1);
      sVar1 = sVar1 + 1;
    } while (mprtypes_size + (mprtypes_size == 0) != sVar1);
  }
  return sVar1;
}

Assistant:

size_t
nhdp_domain_process_mprtypes_tlv(uint8_t *mprtypes, size_t mprtypes_size, struct rfc5444_reader_tlvblock_entry *tlv) {
  struct nhdp_domain *domain;
  size_t count;

  if (!tlv) {
    domain = list_first_element(&_domain_list, domain, _node);
    mprtypes[0] = domain->ext;

    return 1;
  }

  memset(mprtypes, 255, mprtypes_size);

  count = 0;
  list_for_each_element(&_domain_list, domain, _node) {
    mprtypes[count++] = domain->ext;
    if (count >= mprtypes_size) {
      break;
    }
  }
  return count;
}